

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources> * __thiscall
de::SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources>::operator=
          (SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources> *this,
          SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources> *other)

{
  SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources> *other_local;
  SharedPtr<vkt::api::(anonymous_namespace)::ImageView::Resources> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}